

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

boolean the_unique_obj(obj *obj)

{
  bool local_1a;
  bool local_19;
  obj *obj_local;
  
  if ((*(uint *)&obj->field_0x4a >> 5 & 1) == 0) {
    obj_local._7_1_ = false;
  }
  else if ((obj->otyp == 0xd8) && ((*(uint *)&obj->field_0x4a >> 4 & 1) == 0)) {
    obj_local._7_1_ = true;
  }
  else {
    local_19 = false;
    if (((byte)objects[obj->otyp].field_0x10 >> 6 & 1) != 0) {
      local_1a = true;
      if ((*(uint *)&obj->field_0x4a >> 4 & 1) == 0) {
        local_1a = obj->otyp == 0xd9;
      }
      local_19 = local_1a;
    }
    obj_local._7_1_ = local_19;
  }
  return obj_local._7_1_;
}

Assistant:

boolean the_unique_obj(const struct obj *obj)
{
    if (!obj->dknown)
	return FALSE;
    else if (obj->otyp == FAKE_AMULET_OF_YENDOR && !obj->known)
	return TRUE;		/* lie */
    else
	return (boolean)(objects[obj->otyp].oc_unique &&
			 (obj->known || obj->otyp == AMULET_OF_YENDOR));
}